

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O3

void InstructionSet::x86::Primitive::
     ret_near<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> instruction,Context *context)

{
  type_conflict2 tVar1;
  short local_1c [2];
  
  tVar1 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                    (&context->memory,SS,(context->registers).sp_);
  local_1c[0] = 0;
  local_1c[1] = instruction.extensions_[0];
  (context->registers).sp_ =
       (context->registers).sp_ +
       *(short *)((long)local_1c + (ulong)((uint)((ulong)instruction >> 0xc) & 2)) + 2;
  ((context->flow_controller).registers_)->ip_ = tVar1;
  return;
}

Assistant:

void ret_near(
	InstructionT instruction,
	ContextT &context
) {
	const auto ip = pop<uint16_t, false>(context);
	context.registers.sp() += instruction.operand();
	context.flow_controller.template jump<uint16_t>(ip);
}